

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *this;
  bool bVar1;
  int __n;
  ostream *poVar2;
  int iVar3;
  undefined1 local_318 [8];
  Server srv;
  TSpellCorrector corrector;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  undefined1 local_60 [8];
  string modelFile;
  string hostname;
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)local_60,argv[1],(allocator *)&srv.running_threads_);
    std::__cxx11::string::string
              ((string *)(modelFile.field_2._M_local_buf + 8),argv[2],
               (allocator *)&srv.running_threads_);
    std::__cxx11::string::string((string *)&srv.running_threads_,argv[3],(allocator *)local_318);
    __n = std::__cxx11::stoi((string *)&srv.running_threads_,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&srv.running_threads_);
    NJamSpell::TSpellCorrector::TSpellCorrector((TSpellCorrector *)&srv.running_threads_);
    poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
    std::endl<char,std::char_traits<char>>(poVar2);
    this = &srv.running_threads_;
    bVar1 = NJamSpell::TSpellCorrector::LoadLangModel((TSpellCorrector *)this,(string *)local_60);
    if (bVar1) {
      httplib::Server::Server((Server *)local_318);
      corrector.MaxCandidatesToCheck = (size_t)this;
      httplib::Server::Get((Server *)local_318,"/fix",(Handler *)&corrector.MaxCandidatesToCheck);
      std::_Function_base::~_Function_base((_Function_base *)&corrector.MaxCandidatesToCheck);
      local_c0._8_8_ = 0;
      local_a8 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:77:22)>
                 ::_M_invoke;
      local_b0 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:77:22)>
                 ::_M_manager;
      local_c0._M_unused._M_object = this;
      httplib::Server::Post((Server *)local_318,"/fix",(Handler *)&local_c0);
      std::_Function_base::~_Function_base((_Function_base *)&local_c0);
      local_a0._8_8_ = 0;
      local_88 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:81:28)>
                 ::_M_invoke;
      local_90 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:81:28)>
                 ::_M_manager;
      local_a0._M_unused._M_object = this;
      httplib::Server::Get((Server *)local_318,"/candidates",(Handler *)&local_a0);
      std::_Function_base::~_Function_base((_Function_base *)&local_a0);
      local_80._8_8_ = 0;
      local_68 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:85:29)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/web_server/main.cpp:85:29)>
                 ::_M_manager;
      local_80._M_unused._M_object = this;
      httplib::Server::Post((Server *)local_318,"/candidates",(Handler *)&local_80);
      std::_Function_base::~_Function_base((_Function_base *)&local_80);
      poVar2 = std::operator<<((ostream *)&std::cerr,"[info] starting web server at ");
      poVar2 = std::operator<<(poVar2,(string *)(modelFile.field_2._M_local_buf + 8));
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,__n);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 0;
      httplib::Server::listen((Server *)local_318,modelFile.field_2._8_4_,__n);
      httplib::Server::~Server((Server *)local_318);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 0x2a;
    }
    NJamSpell::TSpellCorrector::~TSpellCorrector((TSpellCorrector *)&srv.running_threads_);
    std::__cxx11::string::~string((string *)(modelFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," model.bin localhost 8080\n");
    iVar3 = 0x2a;
  }
  return iVar3;
}

Assistant:

int main(int argc, const char** argv) {
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " model.bin localhost 8080\n";
        return 42;
    }

    std::string modelFile = argv[1];
    std::string hostname = argv[2];
    int port = std::stoi(argv[3]);

    NJamSpell::TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }

    httplib::Server srv;
    srv.Get("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.body) + "\n", "text/plain");
    });

    srv.Get("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.body) + "\n", "text/plain");
    });

    std::cerr << "[info] starting web server at " << hostname << ":" << port << std::endl;
    srv.listen(hostname.c_str(), port);
    return 0;
}